

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlParserCtxtPtr htmlNewSAXParserCtxt(htmlSAXHandler *sax,void *userData)

{
  xmlParserCtxtPtr ctxt;
  xmlDictPtr pxVar1;
  _xmlSAXHandler *__s;
  xmlParserInputPtr *ppxVar2;
  xmlNodePtr *ppxVar3;
  xmlChar **ppxVar4;
  int *piVar5;
  
  ctxt = (xmlParserCtxtPtr)(*xmlMalloc)(0x2f0);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    htmlErrMemory((xmlParserCtxtPtr)0x0,"NewParserCtxt: out of memory\n");
    return (htmlParserCtxtPtr)0x0;
  }
  memset(ctxt,0,0x2f0);
  pxVar1 = xmlDictCreate();
  ctxt->dict = pxVar1;
  if (pxVar1 == (xmlDictPtr)0x0) {
LAB_0014cd36:
    htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
  }
  else {
    __s = ctxt->sax;
    if (__s == (_xmlSAXHandler *)0x0) {
      __s = (_xmlSAXHandler *)(*xmlMalloc)(0x100);
      ctxt->sax = __s;
      if (__s == (_xmlSAXHandler *)0x0) goto LAB_0014cd36;
    }
    if (sax == (htmlSAXHandler *)0x0) {
      memset(__s,0,0x100);
      xmlSAX2InitHtmlDefaultSAXHandler(ctxt->sax);
      userData = ctxt;
    }
    else {
      memcpy(__s,sax,0x100);
      if (userData == (void *)0x0) {
        userData = ctxt;
      }
    }
    ctxt->userData = userData;
    ppxVar2 = (xmlParserInputPtr *)(*xmlMalloc)(0x28);
    ctxt->inputTab = ppxVar2;
    if (ppxVar2 == (xmlParserInputPtr *)0x0) {
      htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
      ctxt->input = (xmlParserInputPtr)0x0;
      ctxt->inputNr = 0;
      ctxt->inputMax = 0;
    }
    else {
      ctxt->inputNr = 0;
      ctxt->inputMax = 5;
      ctxt->input = (xmlParserInputPtr)0x0;
      ctxt->version = (xmlChar *)0x0;
      ctxt->encoding = (xmlChar *)0x0;
      ctxt->standalone = -1;
      ctxt->instate = XML_PARSER_START;
      ppxVar3 = (xmlNodePtr *)(*xmlMalloc)(0x50);
      ctxt->nodeTab = ppxVar3;
      if (ppxVar3 == (xmlNodePtr *)0x0) {
        htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
        ctxt->input = (xmlParserInputPtr)0x0;
        ctxt->inputNr = 0;
        ctxt->inputMax = 0;
        ctxt->node = (xmlNodePtr)0x0;
        ctxt->nodeNr = 0;
        ctxt->nodeMax = 0;
      }
      else {
        ctxt->nodeNr = 0;
        ctxt->nodeMax = 10;
        ctxt->node = (xmlNodePtr)0x0;
        ppxVar4 = (xmlChar **)(*xmlMalloc)(0x50);
        ctxt->nameTab = ppxVar4;
        if (ppxVar4 != (xmlChar **)0x0) {
          ctxt->nameNr = 0;
          ctxt->nameMax = 10;
          ctxt->name = (xmlChar *)0x0;
          ctxt->myDoc = (xmlDocPtr)0x0;
          ctxt->nodeInfoNr = 0;
          ctxt->nodeInfoMax = 0;
          ctxt->nodeInfoTab = (xmlParserNodeInfo *)0x0;
          ctxt->wellFormed = 1;
          ctxt->replaceEntities = 0;
          piVar5 = __xmlLineNumbersDefaultValue();
          ctxt->linenumbers = *piVar5;
          piVar5 = __xmlKeepBlanksDefaultValue();
          ctxt->keepBlanks = *piVar5;
          ctxt->html = 1;
          (ctxt->vctxt).flags = 2;
          (ctxt->vctxt).userData = ctxt;
          (ctxt->vctxt).error = xmlParserValidityError;
          (ctxt->vctxt).warning = xmlParserValidityWarning;
          ctxt->record_info = 0;
          ctxt->validate = 0;
          ctxt->checkIndex = 0;
          ctxt->catalogs = (void *)0x0;
          xmlInitNodeInfoSeq(&ctxt->node_seq);
          return ctxt;
        }
        htmlErrMemory((xmlParserCtxtPtr)0x0,"htmlInitParserCtxt: out of memory\n");
        ctxt->input = (xmlParserInputPtr)0x0;
        ctxt->inputNr = 0;
        ctxt->inputMax = 0;
        ctxt->node = (xmlNodePtr)0x0;
        ctxt->nodeNr = 0;
        ctxt->nodeMax = 0;
        ctxt->name = (xmlChar *)0x0;
        ctxt->nameNr = 0;
        ctxt->nameMax = 0;
      }
    }
  }
  xmlFreeParserCtxt(ctxt);
  return (htmlParserCtxtPtr)0x0;
}

Assistant:

htmlParserCtxtPtr
htmlNewSAXParserCtxt(const htmlSAXHandler *sax, void *userData)
{
    xmlParserCtxtPtr ctxt;

    ctxt = (xmlParserCtxtPtr) xmlMalloc(sizeof(xmlParserCtxt));
    if (ctxt == NULL) {
        htmlErrMemory(NULL, "NewParserCtxt: out of memory\n");
	return(NULL);
    }
    memset(ctxt, 0, sizeof(xmlParserCtxt));
    if (htmlInitParserCtxt(ctxt, sax, userData) < 0) {
        htmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}